

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

void ssh2_connection_special_cmd(PacketProtocolLayer *ppl,SessionSpecialCode code,int arg)

{
  PktOut *pPVar1;
  
  if ((code & ~SS_EOF) == SS_NOP) {
    if ((ppl->remote_bugs & 0x200) == 0) {
      pPVar1 = (*ppl->bpp->vt->new_pktout)(2);
      BinarySink_put_stringz(pPVar1->binarysink_,"");
      pq_base_push(&ppl->out_pq->pqb,&pPVar1->qnode);
      return;
    }
  }
  else if (ppl[-2].vt != (PacketProtocolLayerVtable *)0x0) {
    mainchan_special_cmd((mainchan *)ppl[-2].vt,code,arg);
    return;
  }
  return;
}

Assistant:

static void ssh2_connection_special_cmd(PacketProtocolLayer *ppl,
                                        SessionSpecialCode code, int arg)
{
    struct ssh2_connection_state *s =
        container_of(ppl, struct ssh2_connection_state, ppl);
    PktOut *pktout;

    if (code == SS_PING || code == SS_NOP) {
        if (!(s->ppl.remote_bugs & BUG_CHOKES_ON_SSH2_IGNORE)) {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_IGNORE);
            put_stringz(pktout, "");
            pq_push(s->ppl.out_pq, pktout);
        }
    } else if (s->mainchan) {
        mainchan_special_cmd(s->mainchan, code, arg);
    }
}